

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O1

ps_search_t *
allphone_search_init
          (char *name,ngram_model_t *lm,ps_config_t *config,acmod_t *acmod,dict_t *dict,
          dict2pid_t *d2p)

{
  byte bVar1;
  bin_mdef_t *m;
  bin_mdef_t *pbVar2;
  bin_mdef_t *pbVar3;
  mdef_entry_t *pmVar4;
  long lVar5;
  _func_void_ps_search_t_ptr *p_Var6;
  logmath_t *plVar7;
  int iVar8;
  int iVar9;
  int32 iVar10;
  int32 iVar11;
  int32 iVar12;
  int32 iVar13;
  ps_search_t *search;
  ps_searchfuncs_t *ppVar14;
  ps_search_t *ppVar15;
  void *ptr;
  hmm_t *hmm;
  _func_int_ps_search_t_ptr_dict_t_ptr_dict2pid_t_ptr *p_Var16;
  ushort *ptr_00;
  uint *puVar17;
  _func_char_ptr_ps_search_t_ptr_int32_ptr *p_Var18;
  ngram_model_t *pnVar19;
  char *pcVar20;
  cmd_ln_t *pcVar21;
  ps_latlink_t *ppVar22;
  short sVar23;
  ulong uVar24;
  _func_int_ps_search_t_ptr_dict_t_ptr_dict2pid_t_ptr *p_Var25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  short sVar32;
  ushort *puVar33;
  ps_searchfuncs_t *ppVar34;
  ushort uVar35;
  int iVar36;
  uint uVar37;
  double dVar38;
  ulong local_70;
  
  search = (ps_search_t *)
           __ckd_calloc__(1,0x108,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                          ,0x217);
  ps_search_init(search,&allphone_funcs,"allphone",name,config,acmod,dict,d2p);
  m = acmod->mdef;
  local_70 = 0;
  ppVar14 = (ps_searchfuncs_t *)
            hmm_context_init(m->n_emit_state,acmod->tmat->tp,(int16 *)0x0,m->sseq);
  search[1].vt = ppVar14;
  if (ppVar14 == (ps_searchfuncs_t *)0x0) {
    (*search->vt->free)(search);
LAB_0011cd66:
    search = (ps_search_t *)0x0;
  }
  else {
    iVar8 = ps_config_bool(config,"allphone_ci");
    *(int *)&search[1].name = iVar8;
    dVar38 = ps_config_float(config,"lw");
    *(int *)&search[1].dict = (int)dVar38;
    pbVar2 = search->acmod->mdef;
    ppVar15 = (ps_search_t *)
              __ckd_calloc__((long)pbVar2->n_ciphone,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0xeb);
    search[1].pls = ppVar15;
    ptr = __ckd_calloc__((long)pbVar2->n_phone,8,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                         ,0xed);
    iVar8 = (&pbVar2->n_ciphone)[*(int *)&search[1].name == 0];
    uVar27 = (ulong)iVar8;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0xf2,"Building PHMM net of %d phones\n");
    if (0 < (long)uVar27) {
      uVar28 = 0;
      local_70 = 0;
      do {
        pbVar3 = search->acmod->mdef;
        uVar24 = uVar28;
        if ((long)pbVar3->n_ciphone <= (long)uVar28) {
          uVar24 = (ulong)pbVar3->phone[uVar28].info.ci.reserved[0];
        }
        hmm = (hmm_t *)(&(search[1].pls)->vt)[uVar24 & 0xffffffff];
        if (hmm != (hmm_t *)0x0) {
          pmVar4 = pbVar3->phone;
          do {
            if ((pmVar4[*(int *)&hmm[1].ctx].tmat == pmVar4[uVar28].tmat) &&
               (pmVar4[*(int *)&hmm[1].ctx].ssid == pmVar4[uVar28].ssid)) goto LAB_0011c74a;
            hmm = *(hmm_t **)((long)hmm[1].score + 0x10);
          } while (hmm != (hmm_t *)0x0);
        }
        hmm = (hmm_t *)0x0;
LAB_0011c74a:
        if (hmm == (hmm_t *)0x0) {
          hmm = (hmm_t *)__ckd_calloc__(1,0x80,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                        ,0xf6);
          hmm_init((hmm_context_t *)search[1].vt,hmm,0,pbVar2->phone[uVar28].ssid,
                   pbVar2->phone[uVar28].tmat);
          *(int *)&hmm[1].ctx = (int)uVar28;
          uVar35 = (ushort)uVar28;
          if ((long)pbVar2->n_ciphone <= (long)uVar28) {
            uVar35 = (ushort)pbVar2->phone[uVar28].info.ci.reserved[0];
          }
          *(ushort *)((long)&hmm[1].ctx + 4) = uVar35;
          hmm[1].history[1] = 0;
          hmm[1].history[2] = 0;
          ppVar15 = search[1].pls;
          *(ps_searchfuncs_t **)(hmm[1].score + 4) = (&ppVar15->vt)[(short)uVar35];
          (&ppVar15->vt)[(short)uVar35] = (ps_searchfuncs_t *)hmm;
          local_70 = (ulong)((int)local_70 + 1);
        }
        *(hmm_t **)((long)ptr + uVar28 * 8) = hmm;
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar27);
    }
    iVar26 = pbVar2->n_ciphone + 0x1f;
    iVar9 = pbVar2->n_ciphone + 0x3e;
    if (-1 < iVar26) {
      iVar9 = iVar26;
    }
    iVar36 = (int)local_70 * (iVar9 >> 5);
    p_Var16 = (_func_int_ps_search_t_ptr_dict_t_ptr_dict2pid_t_ptr *)
              __ckd_calloc__((long)(iVar36 * 2),4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0x105);
    iVar26 = pbVar2->n_ciphone;
    if (0 < (long)iVar26) {
      p_Var25 = p_Var16 + (long)iVar36 * 4;
      ppVar15 = search[1].pls;
      lVar30 = (long)(iVar9 >> 5) * 4;
      sVar32 = 0;
      do {
        for (ppVar14 = (&ppVar15->vt)[sVar32]; ppVar14 != (ps_searchfuncs_t *)0x0;
            ppVar14 = (ps_searchfuncs_t *)ppVar14[1].lattice) {
          ppVar14[1].reinit = p_Var16;
          ppVar14[1].free = (_func_void_ps_search_t_ptr *)p_Var25;
          p_Var16 = p_Var16 + lVar30;
          p_Var25 = p_Var25 + lVar30;
        }
        sVar32 = sVar32 + 1;
      } while (sVar32 < iVar26);
    }
    ptr_00 = (ushort *)
             __ckd_calloc__((long)iVar26 + 1,2,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                            ,0x113);
    iVar26 = pbVar2->n_ciphone;
    uVar28 = 0;
    if (0 < iVar26) {
      sVar32 = 1;
      do {
        uVar35 = sVar32 - 1;
        lVar30 = *(long *)((long)ptr + (long)(short)uVar35 * 8);
        iVar9 = iVar26 + 0x3e;
        if (-1 < iVar26 + 0x1f) {
          iVar9 = iVar26 + 0x1f;
        }
        memset(*(void **)(lVar30 + 0x60),0xff,(long)(iVar9 >> 5) << 2);
        iVar26 = pbVar2->n_ciphone + 0x1f;
        iVar9 = pbVar2->n_ciphone + 0x3e;
        if (-1 < iVar26) {
          iVar9 = iVar26;
        }
        memset(*(void **)(lVar30 + 0x68),0xff,(long)(iVar9 >> 5) << 2);
        if (pbVar2->phone[(short)uVar35].info.ci.filler != '\0') {
          iVar26 = (int)uVar28;
          uVar28 = (ulong)(iVar26 + 1);
          ptr_00[iVar26] = uVar35;
        }
        iVar9 = (int)sVar32;
        iVar26 = pbVar2->n_ciphone;
        sVar32 = sVar32 + 1;
      } while (iVar9 < iVar26);
      uVar28 = (ulong)(int)uVar28;
    }
    ptr_00[uVar28] = 0xffff;
    if (iVar26 < iVar8) {
      pmVar4 = pbVar2->phone;
      uVar28 = (ulong)iVar26;
      do {
        lVar30 = *(long *)((long)ptr + uVar28 * 8);
        bVar1 = pmVar4[uVar28].info.ci.reserved[1];
        if (pmVar4[bVar1].info.ci.filler == '\0') {
          puVar17 = (uint *)(*(long *)(lVar30 + 0x60) + (ulong)(bVar1 >> 5) * 4);
          *puVar17 = *puVar17 | 1 << (bVar1 & 0x1f);
        }
        else {
          uVar35 = *ptr_00;
          if (-1 < (short)uVar35) {
            lVar5 = *(long *)(lVar30 + 0x60);
            puVar33 = ptr_00 + 1;
            do {
              puVar17 = (uint *)(lVar5 + (ulong)(uVar35 >> 5) * 4);
              *puVar17 = *puVar17 | 1 << ((byte)uVar35 & 0x1f);
              uVar35 = *puVar33;
              puVar33 = puVar33 + 1;
            } while (-1 < (short)uVar35);
          }
        }
        bVar1 = pmVar4[uVar28].info.ci.reserved[2];
        if (pmVar4[bVar1].info.ci.filler == '\0') {
          puVar17 = (uint *)(*(long *)(lVar30 + 0x68) + (ulong)(bVar1 >> 5) * 4);
          *puVar17 = *puVar17 | 1 << (bVar1 & 0x1f);
        }
        else {
          uVar35 = *ptr_00;
          if (-1 < (short)uVar35) {
            lVar30 = *(long *)(lVar30 + 0x68);
            puVar33 = ptr_00 + 1;
            do {
              puVar17 = (uint *)(lVar30 + (ulong)(uVar35 >> 5) * 4);
              *puVar17 = *puVar17 | 1 << ((byte)uVar35 & 0x1f);
              uVar35 = *puVar33;
              puVar33 = puVar33 + 1;
            } while (-1 < (short)uVar35);
          }
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar27);
    }
    ckd_free(ptr);
    ckd_free(ptr_00);
    ppVar15 = search[1].pls;
    pbVar2 = search->acmod->mdef;
    puVar17 = (uint *)__ckd_calloc__((long)pbVar2->n_ciphone + 1,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                     ,0xb5);
    if (pbVar2->n_ciphone < 1) {
      uVar37 = 0;
    }
    else {
      iVar8 = 0;
      sVar32 = 0;
      uVar37 = 0;
      do {
        ppVar14 = (&ppVar15->vt)[sVar32];
        if (ppVar14 != (ps_searchfuncs_t *)0x0) {
          iVar26 = iVar8 + 0x1f;
          if (-1 < iVar8) {
            iVar26 = iVar8;
          }
          do {
            if (pbVar2->n_ciphone < 1) {
              lVar30 = 0;
            }
            else {
              p_Var6 = ppVar14[1].free;
              uVar29 = 0;
              sVar23 = 1;
              iVar9 = 0;
              do {
                uVar31 = uVar29 + 0x1f;
                if (-1 < (int)uVar29) {
                  uVar31 = uVar29;
                }
                if ((*(uint *)(p_Var6 + (long)((int)uVar31 >> 5) * 4) >> (uVar29 & 0x1f) & 1) != 0)
                {
                  lVar30 = (long)iVar9;
                  iVar9 = iVar9 + 1;
                  puVar17[lVar30] = uVar29;
                }
                uVar29 = (uint)sVar23;
                sVar23 = sVar23 + 1;
              } while ((int)uVar29 < pbVar2->n_ciphone);
              lVar30 = (long)iVar9;
            }
            puVar17[lVar30] = 0xffffffff;
            uVar29 = *puVar17;
            if (-1 < (int)uVar29) {
              lVar30 = 0;
              do {
                for (ppVar34 = (&ppVar15->vt)[uVar29]; ppVar34 != (ps_searchfuncs_t *)0x0;
                    ppVar34 = (ps_searchfuncs_t *)ppVar34[1].lattice) {
                  if ((*(uint *)(ppVar34[1].reinit + (long)(iVar26 >> 5) * 4) &
                      (uint)(1L << ((byte)iVar8 & 0x1f))) != 0) {
                    p_Var18 = (_func_char_ptr_ps_search_t_ptr_int32_ptr *)
                              __ckd_calloc__(1,0x10,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                             ,200);
                    *(ps_searchfuncs_t **)p_Var18 = ppVar34;
                    *(_func_char_ptr_ps_search_t_ptr_int32_ptr **)(p_Var18 + 8) = ppVar14[1].hyp;
                    ppVar14[1].hyp = p_Var18;
                    uVar37 = uVar37 + 1;
                  }
                }
                uVar29 = puVar17[lVar30 + 1];
                lVar30 = lVar30 + 1;
              } while (-1 < (int)uVar29);
            }
            ppVar14 = (ps_searchfuncs_t *)ppVar14[1].lattice;
          } while (ppVar14 != (ps_searchfuncs_t *)0x0);
        }
        sVar32 = sVar32 + 1;
        iVar8 = (int)sVar32;
      } while (iVar8 < pbVar2->n_ciphone);
    }
    ckd_free(puVar17);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x13b,"%d nodes, %d links\n",local_70,(ulong)uVar37);
    if (lm == (ngram_model_t *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
              ,0x244,
              "Failed to load language model specified in -allphone, doing unconstrained phone-loop decoding\n"
             );
      plVar7 = acmod->lmath;
      dVar38 = ps_config_float(config,"pip");
      iVar8 = logmath_log(plVar7,(float64)dVar38);
      *(int *)((long)&search[1].dict + 4) = iVar8 * *(int *)&search[1].dict >> 10;
    }
    else {
      pnVar19 = ngram_model_retain(lm);
      search[1].type = (char *)pnVar19;
      pcVar20 = bin_mdef_ciphone_str(m,m->sil);
      iVar10 = ngram_wid(pnVar19,pcVar20);
      iVar11 = ngram_unknown_wid((ngram_model_t *)search[1].type);
      if (iVar10 == iVar11) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                ,0x231,"Phonetic LM does not have SIL phone in vocabulary\n");
        allphone_search_free(search);
      }
      else {
        pcVar21 = (cmd_ln_t *)
                  __ckd_calloc__((long)m->n_ciphone,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                 ,0x238);
        search[1].config = pcVar21;
        if (0 < m->n_ciphone) {
          lVar30 = 0;
          do {
            pnVar19 = (ngram_model_t *)search[1].type;
            pcVar20 = bin_mdef_ciphone_str(m,(int32)lVar30);
            iVar12 = ngram_wid(pnVar19,pcVar20);
            (&(search[1].config)->refcount)[lVar30] = iVar12;
            iVar13 = ngram_unknown_wid((ngram_model_t *)search[1].type);
            if (iVar12 == iVar13) {
              (&(search[1].config)->refcount)[lVar30] = iVar10;
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 < m->n_ciphone);
        }
      }
      if (iVar10 == iVar11) goto LAB_0011cd66;
    }
    *(undefined4 *)&search[1].hyp_str = 0;
    *(undefined4 *)&search[1].d2p = 0xffffffff;
    search[1].post = 0;
    search[1].n_words = 0;
    plVar7 = acmod->lmath;
    dVar38 = ps_config_float(config,"beam");
    iVar8 = logmath_log(plVar7,(float64)dVar38);
    *(int *)&search[1].acmod = iVar8 >> 10;
    plVar7 = acmod->lmath;
    dVar38 = ps_config_float(config,"pbeam");
    iVar8 = logmath_log(plVar7,(float64)dVar38);
    *(int *)((long)&search[1].acmod + 4) = iVar8 >> 10;
    ppVar22 = (ps_latlink_t *)blkarray_list_init();
    search[1].last_link = ppVar22;
    dVar38 = ps_config_float(config,"ascale");
    *(float *)((long)&search[1].d2p + 4) = (float)(1.0 / dVar38);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x261,"Allphone(beam: %d, pbeam: %d)\n",(ulong)*(uint *)&search[1].acmod,
            (ulong)*(uint *)((long)&search[1].acmod + 4));
    ptmr_init((ptmr_t *)&search[1].start_wid);
  }
  return search;
}

Assistant:

ps_search_t *
allphone_search_init(const char *name,
                     ngram_model_t * lm,
                     ps_config_t * config,
                     acmod_t * acmod, dict_t * dict, dict2pid_t * d2p)
{
    int i;
    bin_mdef_t *mdef;
    allphone_search_t *allphs;

    allphs = (allphone_search_t *) ckd_calloc(1, sizeof(*allphs));
    ps_search_init(ps_search_base(allphs), &allphone_funcs, PS_SEARCH_TYPE_ALLPHONE, name, config, acmod,
                   dict, d2p);
    mdef = acmod->mdef;

    allphs->hmmctx = hmm_context_init(bin_mdef_n_emit_state(mdef),
                                      acmod->tmat->tp, NULL, mdef->sseq);
    if (allphs->hmmctx == NULL) {
        ps_search_free(ps_search_base(allphs));
        return NULL;
    }

    allphs->ci_only = ps_config_bool(config, "allphone_ci");
    allphs->lw = ps_config_float(config, "lw");

    phmm_build(allphs);

    if (lm) {
	int32 silwid;
	
        allphs->lm = ngram_model_retain(lm);
        
        silwid = ngram_wid(allphs->lm, bin_mdef_ciphone_str(mdef,
                                                            mdef_silphone
                                                            (mdef)));
	if (silwid == ngram_unknown_wid(allphs->lm)) {
	    E_ERROR("Phonetic LM does not have SIL phone in vocabulary\n");
	    allphone_search_free((ps_search_t *) allphs);
	    return NULL;
	}
        
        allphs->ci2lmwid =
            (int32 *) ckd_calloc(mdef->n_ciphone,
                                 sizeof(*allphs->ci2lmwid));
        for (i = 0; i < mdef->n_ciphone; i++) {
            allphs->ci2lmwid[i] =
                ngram_wid(allphs->lm,
                          (char *) bin_mdef_ciphone_str(mdef, i));
            /* Map filler phones and other missing phones to silence if not found */
            if (allphs->ci2lmwid[i] == ngram_unknown_wid(allphs->lm))
                allphs->ci2lmwid[i] = silwid;
        }
    }
    else {
        E_WARN
            ("Failed to load language model specified in -allphone, doing unconstrained phone-loop decoding\n");
        allphs->inspen =
            (int32) (logmath_log
                     (acmod->lmath, ps_config_float(config, "pip"))
                     * allphs->lw) >> SENSCR_SHIFT;
    }

    allphs->n_tot_frame = 0;
    allphs->frame = -1;
    allphs->segments = NULL;

    /* Get search pruning parameters */
    allphs->beam
        =
        (int32) logmath_log(acmod->lmath,
                            ps_config_float(config, "beam"))
        >> SENSCR_SHIFT;
    allphs->pbeam
        =
        (int32) logmath_log(acmod->lmath,
                            ps_config_float(config, "pbeam"))
        >> SENSCR_SHIFT;

    /* LM related weights/penalties */
    allphs->history = blkarray_list_init();

    /* Acoustic score scale for posterior probabilities. */
    allphs->ascale = 1.0 / ps_config_float(config, "ascale");

    E_INFO("Allphone(beam: %d, pbeam: %d)\n", allphs->beam, allphs->pbeam);

    ptmr_init(&allphs->perf);

    return (ps_search_t *) allphs;
}